

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

bool __thiscall PhyloTree::equals(PhyloTree *this,PhyloTree *t)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_80;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> local_38;
  
  __first1 = (this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  __last1 = (this->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __first2 = (t->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((long)__last1 - (long)__first1 ==
      (long)(t->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
    bVar1 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      (__first1,__last1,__first2);
  }
  else {
    bVar1 = false;
  }
  if (bVar1 != false) {
    std::vector<double,_std::allocator<double>_>::vector(&local_38,&this->leafEdgeLengths);
    std::vector<double,_std::allocator<double>_>::vector(&local_50,&t->leafEdgeLengths);
    bVar2 = Tools::vector_equal<double>(&local_38,&local_50);
    if (bVar2) {
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_68,&this->edges);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_80,&t->edges);
      bVar3 = Tools::vector_equal<PhyloTreeEdge>(&local_68,&local_80);
      bVar2 = true;
      goto LAB_00120f2f;
    }
  }
  bVar2 = false;
  bVar3 = false;
LAB_00120f2f:
  if (bVar2) {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_80);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_68);
  }
  if (bVar1 != false) {
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar3;
}

Assistant:

bool PhyloTree::equals(const PhyloTree& t) {
    return (leaf2NumMap == t.leaf2NumMap) && Tools::vector_equal(leafEdgeLengths, t.leafEdgeLengths) && Tools::vector_equal(edges, t.edges);
}